

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O1

mi_page_t * mi_segment_span_allocate(mi_segment_t *segment,size_t slice_index,size_t slice_count)

{
  size_t *psVar1;
  size_t *psVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  _Bool _Var11;
  size_t i;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  mi_msecs_t mVar15;
  mi_page_t *pmVar16;
  mi_page_t *pmVar17;
  long lVar18;
  long lVar19;
  size_t size;
  ulong uVar20;
  bool bVar21;
  _Bool is_zero;
  size_t full_size;
  uint8_t *start;
  mi_commit_mask_t mask;
  _Bool local_c9;
  size_t local_c8;
  size_t local_c0;
  uint8_t *local_b8;
  mi_commit_mask_t local_b0;
  undefined8 uStack_70;
  uint local_68 [14];
  
  size = slice_count << 0x10;
  if ((segment->commit_mask).mask[0] == 0xffffffffffffffff) {
    uVar12 = 0;
    do {
      uVar14 = uVar12;
      if (uVar14 == 7) {
        uVar14 = 7;
        break;
      }
      uVar12 = uVar14 + 1;
    } while ((segment->commit_mask).mask[uVar14 + 1] == 0xffffffffffffffff);
    if ((6 < uVar14) && ((segment->purge_mask).mask[0] == 0)) {
      uVar12 = 0;
      do {
        uVar14 = uVar12;
        if (uVar14 == 7) {
          uVar14 = 7;
          break;
        }
        uVar12 = uVar14 + 1;
      } while ((segment->purge_mask).mask[uVar14 + 1] == 0);
      if (6 < uVar14) goto LAB_00464690;
    }
  }
  bVar21 = false;
  local_b8 = (uint8_t *)0x0;
  local_c0 = 0;
  local_c8 = slice_count;
  mi_segment_commit_mask
            (segment,false,(uint8_t *)(slice_index * 0x10000 + (long)segment),size,&local_b8,
             &local_c0,&local_b0);
  sVar10 = local_c0;
  if (local_b0.mask[0] == 0) {
    uVar12 = 0xffffffffffffffff;
    do {
      if (uVar12 == 6) {
        uVar14 = 7;
        break;
      }
      uVar14 = uVar12 + 1;
      lVar13 = uVar12 + 2;
      uVar12 = uVar14;
    } while (local_b0.mask[lVar13] == 0);
    bVar21 = 6 < uVar14;
  }
  slice_count = local_c8;
  if (local_c0 == 0 || bVar21) goto LAB_00464690;
  if ((local_b0.mask[0] & ~(segment->commit_mask).mask[0]) == 0) {
    uVar12 = 0;
    do {
      uVar14 = uVar12;
      if (uVar14 == 7) {
        uVar14 = 7;
        break;
      }
      uVar12 = uVar14 + 1;
    } while ((local_b0.mask[uVar14 + 1] & ~(segment->commit_mask).mask[uVar14 + 1]) == 0);
    if (uVar14 < 7) goto LAB_00464577;
  }
  else {
LAB_00464577:
    local_c9 = false;
    lVar13 = 0;
    do {
      psVar1 = (segment->commit_mask).mask + lVar13;
      uVar4 = *(uint *)((long)psVar1 + 4);
      sVar8 = psVar1[1];
      uVar5 = *(uint *)((long)psVar1 + 0xc);
      uVar6 = *(uint *)((long)local_b0.mask + lVar13 * 8 + 4);
      sVar9 = local_b0.mask[lVar13 + 1];
      uVar7 = *(uint *)((long)local_b0.mask + lVar13 * 8 + 0xc);
      *(uint *)(&uStack_70 + lVar13) = (uint)local_b0.mask[lVar13] & (uint)*psVar1;
      *(uint *)((long)&uStack_70 + lVar13 * 8 + 4) = uVar6 & uVar4;
      local_68[lVar13 * 2] = (uint)sVar9 & (uint)sVar8;
      local_68[lVar13 * 2 + 1] = uVar7 & uVar5;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 8);
    lVar13 = 0;
    lVar18 = 0;
    do {
      uVar12 = (&uStack_70)[lVar13];
      if (uVar12 == 0xffffffffffffffff) {
        lVar18 = lVar18 + 0x40;
      }
      else if (uVar12 != 0) {
        do {
          lVar18 = lVar18 + (ulong)((uint)uVar12 & 1);
          bVar21 = 1 < uVar12;
          uVar12 = uVar12 >> 1;
        } while (bVar21);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
    _mi_stat_decrease(&_mi_stats_main.committed,lVar18 << 0x10);
    _Var11 = _mi_os_commit(local_b8,sVar10,&local_c9);
    if (!_Var11) {
      return (mi_page_t *)0x0;
    }
    lVar13 = 0;
    do {
      uVar12 = local_b0.mask[lVar13 + 1];
      psVar1 = (segment->commit_mask).mask + lVar13;
      uVar14 = psVar1[1];
      psVar2 = (segment->commit_mask).mask + lVar13;
      *psVar2 = *psVar1 | local_b0.mask[lVar13];
      psVar2[1] = uVar14 | uVar12;
      lVar13 = lVar13 + 2;
    } while (lVar13 != 8);
  }
  if (((segment->purge_mask).mask[0] & local_b0.mask[0]) == 0) {
    uVar12 = 0;
    do {
      uVar14 = uVar12;
      if (uVar14 == 7) {
        uVar14 = 7;
        break;
      }
      uVar12 = uVar14 + 1;
    } while (((segment->purge_mask).mask[uVar14 + 1] & local_b0.mask[uVar14 + 1]) == 0);
    if (uVar14 < 7) goto LAB_00464654;
  }
  else {
LAB_00464654:
    mVar15 = _mi_clock_now();
    lVar13 = mi_option_get(mi_option_purge_delay);
    segment->purge_expire = lVar13 + mVar15;
  }
  lVar13 = 0;
  do {
    uVar4 = *(uint *)((long)local_b0.mask + lVar13 * 8 + 4);
    sVar10 = local_b0.mask[lVar13 + 1];
    uVar5 = *(uint *)((long)local_b0.mask + lVar13 * 8 + 0xc);
    psVar1 = (segment->purge_mask).mask + lVar13;
    uVar6 = *(uint *)((long)psVar1 + 4);
    sVar8 = psVar1[1];
    uVar7 = *(uint *)((long)psVar1 + 0xc);
    psVar2 = (segment->purge_mask).mask + lVar13;
    *(uint *)psVar2 = ~(uint)local_b0.mask[lVar13] & (uint)*psVar1;
    *(uint *)((long)psVar2 + 4) = ~uVar4 & uVar6;
    *(uint *)(psVar2 + 1) = ~(uint)sVar10 & (uint)sVar8;
    *(uint *)((long)psVar2 + 0xc) = ~uVar5 & uVar7;
    lVar13 = lVar13 + 2;
    slice_count = local_c8;
  } while (lVar13 != 8);
LAB_00464690:
  lVar13 = slice_index * 0x60;
  pmVar16 = segment->slices + slice_index;
  segment->slices[slice_index].slice_offset = 0;
  pmVar16->slice_count = (uint32_t)slice_count;
  segment->slices[slice_index].block_size = size;
  uVar12 = 0xff;
  if (slice_count - 1 < 0xff) {
    uVar12 = slice_count - 1;
  }
  uVar14 = segment->slice_entries;
  uVar20 = ~slice_index + uVar14;
  if (uVar12 + slice_index < uVar14) {
    uVar20 = uVar12;
  }
  if (uVar20 != 0) {
    uVar12 = 2;
    if (2 < uVar20 + 1) {
      uVar12 = uVar20 + 1;
    }
    lVar18 = uVar12 - 1;
    lVar19 = 0x180;
    do {
      *(int *)((long)&segment->purge_mask + lVar19 + lVar13 + -0x34) = (int)lVar19 + -0x120;
      *(undefined4 *)((long)&segment->purge_mask + lVar19 + lVar13 + -0x38) = 0;
      *(undefined8 *)((long)&segment->purge_mask + lVar19 + lVar13 + -0x10) = 1;
      lVar19 = lVar19 + 0x60;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  pmVar17 = segment->slices + uVar14;
  if (pmVar16 + (slice_count - 1) <= segment->slices + uVar14) {
    pmVar17 = pmVar16 + (slice_count - 1);
  }
  if (pmVar16 < pmVar17) {
    pmVar17->slice_offset = (int)pmVar17 - (int)pmVar16;
    pmVar17->slice_count = 0;
    pmVar17->block_size = 1;
  }
  bVar3 = segment->slices[slice_index].field_0x8;
  segment->slices[slice_index].field_0x8 = bVar3 | 1;
  segment->slices[slice_index].field_0x8 =
       bVar3 & 0xfb | 1 | (segment->kind == MI_SEGMENT_HUGE) << 2;
  segment->used = segment->used + 1;
  return pmVar16;
}

Assistant:

static mi_page_t* mi_segment_span_allocate(mi_segment_t* segment, size_t slice_index, size_t slice_count) {
  mi_assert_internal(slice_index < segment->slice_entries);
  mi_slice_t* const slice = &segment->slices[slice_index];
  mi_assert_internal(slice->block_size==0 || slice->block_size==1);

  // commit before changing the slice data
  if (!mi_segment_ensure_committed(segment, _mi_segment_page_start_from_slice(segment, slice, 0, NULL), slice_count * MI_SEGMENT_SLICE_SIZE)) {
    return NULL;  // commit failed!
  }

  // convert the slices to a page
  slice->slice_offset = 0;
  slice->slice_count = (uint32_t)slice_count;
  mi_assert_internal(slice->slice_count == slice_count);
  const size_t bsize = slice_count * MI_SEGMENT_SLICE_SIZE;
  slice->block_size = bsize;
  mi_page_t*  page = mi_slice_to_page(slice);
  mi_assert_internal(mi_page_block_size(page) == bsize);

  // set slice back pointers for the first MI_MAX_SLICE_OFFSET_COUNT entries
  size_t extra = slice_count-1;
  if (extra > MI_MAX_SLICE_OFFSET_COUNT) extra = MI_MAX_SLICE_OFFSET_COUNT;
  if (slice_index + extra >= segment->slice_entries) extra = segment->slice_entries - slice_index - 1;  // huge objects may have more slices than avaiable entries in the segment->slices

  mi_slice_t* slice_next = slice + 1;
  for (size_t i = 1; i <= extra; i++, slice_next++) {
    slice_next->slice_offset = (uint32_t)(sizeof(mi_slice_t)*i);
    slice_next->slice_count = 0;
    slice_next->block_size = 1;
  }

  // and also for the last one (if not set already) (the last one is needed for coalescing and for large alignments)
  // note: the cast is needed for ubsan since the index can be larger than MI_SLICES_PER_SEGMENT for huge allocations (see #543)
  mi_slice_t* last = slice + slice_count - 1;
  mi_slice_t* end = (mi_slice_t*)mi_segment_slices_end(segment);
  if (last > end) last = end;
  if (last > slice) {
    last->slice_offset = (uint32_t)(sizeof(mi_slice_t) * (last - slice));
    last->slice_count = 0;
    last->block_size = 1;
  }

  // and initialize the page
  page->is_committed = true;
  page->is_huge = (segment->kind == MI_SEGMENT_HUGE);
  segment->used++;
  return page;
}